

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype_factory.h
# Opt level: O3

product_type __thiscall
mwheel::
PrototypeFactory<(anonymous_namespace)::Base,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>
::create<>(PrototypeFactory<(anonymous_namespace)::Base,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tag)

{
  int iVar1;
  iterator iVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  _Base_ptr in_RDX;
  product_type pVar4;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>_>_>
          ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>_>_>
                            *)tag[1].field_2._M_allocated_capacity,
                           (_Link_type)&tag[1]._M_string_length,in_RDX,in_RCX);
  if (iVar2._M_node != (_Base_ptr)&tag[1]._M_string_length) {
    iVar1 = std::__cxx11::string::compare((string *)in_RDX);
    if (-1 < iVar1) {
      pVar4.super___shared_ptr<(anonymous_namespace)::Base,_(__gnu_cxx::_Lock_policy)2> =
           (__shared_ptr<(anonymous_namespace)::Base,_(__gnu_cxx::_Lock_policy)2>)
           (**(code **)**(undefined8 **)(iVar2._M_node + 2))(this);
      return (product_type)
             pVar4.super___shared_ptr<(anonymous_namespace)::Base,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  if ((tag->field_2)._M_allocated_capacity != 0) {
    pVar4.super___shared_ptr<(anonymous_namespace)::Base,_(__gnu_cxx::_Lock_policy)2> =
         (__shared_ptr<(anonymous_namespace)::Base,_(__gnu_cxx::_Lock_policy)2>)
         (**(code **)((long)&tag->field_2 + 8))(this,tag);
    return (product_type)
           pVar4.super___shared_ptr<(anonymous_namespace)::Base,_(__gnu_cxx::_Lock_policy)2>;
  }
  uVar3 = std::__throw_bad_function_call();
  __clang_call_terminate(uVar3);
}

Assistant:

product_type create(const TagType &tag, ParameterTypes... parameters) {
    auto iterator = m_prototype_map.find(tag);
    if (iterator == m_prototype_map.end()) {
      return m_on_tag_not_registered(tag);
    }
    return iterator->second->clone(parameters...);
  }